

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::FormulasLoader::end__cn(FormulasLoader *this)

{
  ConstantExpression *pCVar1;
  ConstantExpression *pCVar2;
  ArithmeticExpression *this_00;
  value_type *in_RDI;
  ConstantExpression *constant;
  ArithmeticExpression *expression;
  ConstantExpression *constant2;
  ConstantExpression *constant1;
  INode *node;
  ConstantExpression *in_stack_ffffffffffffffc0;
  String *in_stack_ffffffffffffffd8;
  FormulasLoader *in_stack_ffffffffffffffe0;
  
  if (((ulong)in_RDI[0x1f] & 1) == 0) {
    in_stack_ffffffffffffffc0 = createConstant(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    pCVar1 = createConstant(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    pCVar2 = createConstant(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    this_00 = (ArithmeticExpression *)operator_new(0x28);
    MathML::AST::ArithmeticExpression::ArithmeticExpression(this_00);
    (*(this_00->super_INode)._vptr_INode[6])(this_00,3);
    (*(this_00->super_INode)._vptr_INode[0xb])(this_00,pCVar1);
    (*(this_00->super_INode)._vptr_INode[0xb])(this_00,pCVar2);
  }
  std::
  stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
  ::top((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
         *)0xb27a34);
  std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::push_back
            ((vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
             in_stack_ffffffffffffffc0,in_RDI);
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return true;
}

Assistant:

bool FormulasLoader::end__cn()
	{
		MathML::AST::INode* node;

		if ( mSepOccurred )
		{
			// TODO support for other types than rational
			MathML::AST::ConstantExpression* constant1 = createConstant( mCurrentTextData );
			MathML::AST::ConstantExpression* constant2 = createConstant( mCurrentTextDataAfterSep );
			MathML::AST::ArithmeticExpression* expression = new MathML::AST::ArithmeticExpression();
			expression->setOperator( MathML::AST::ArithmeticExpression::DIV );
			expression->addOperand( constant1 );
			expression->addOperand( constant2 );
			node = expression;
		}
		else
		{
			MathML::AST::ConstantExpression* constant = createConstant( mCurrentTextData );
			node = constant;
		}

		mNodeListStack.top().push_back( node );
		mSepOccurred = false;
		mCurrentTextDataAfterSep.clear();
		mCurrentTextData.clear();

		return true;
	}